

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProductEvaluators.h
# Opt level: O2

void Eigen::internal::
     Assignment<Eigen::Map<Eigen::Matrix<double,_1,_-1,_1,_1,_1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Product<Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_-1,_1,_false>_>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_-1,_-1,_false>,_-1,_-1,_false>,_0>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
     ::run(Map<Eigen::Matrix<double,_1,__1,_1,_1,_1>,_0,_Eigen::Stride<0,_0>_> *dst,SrcXprType *src,
          assign_op<double,_double> *param_3)

{
  long cols;
  
  cols = (src->m_rhs).
         super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
         .
         super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,__1,__1,_false,_true>
         .
         super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,__1,__1,_false>,_1>
         .
         super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,__1,__1,_false>,_0>
         .m_cols.m_value;
  if ((dst->
      super_MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_1>,_0,_Eigen::Stride<0,_0>_>,_1>).
      super_MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
      m_cols.m_value != cols) {
    DenseBase<Eigen::Map<Eigen::Matrix<double,_1,_-1,_1,_1,_1>,_0,_Eigen::Stride<0,_0>_>_>::resize
              ((DenseBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                *)dst,1,cols);
  }
  generic_product_impl<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>const,-1,1,false>const>,Eigen::Block<Eigen::Block<Eigen::Matrix<double,3,1,0,3,1>,-1,-1,false>,-1,-1,false>,Eigen::DenseShape,Eigen::DenseShape,3>
  ::evalTo<Eigen::Map<Eigen::Matrix<double,1,_1,1,1,1>,0,Eigen::Stride<0,0>>>
            (dst,&src->m_lhs,&src->m_rhs);
  return;
}

Assistant:

void run(DstXprType &dst, const SrcXprType &src, const internal::assign_op<Scalar,Scalar> &)
  {
    Index dstRows = src.rows();
    Index dstCols = src.cols();
    if((dst.rows()!=dstRows) || (dst.cols()!=dstCols))
      dst.resize(dstRows, dstCols);
    // FIXME shall we handle nested_eval here?
    generic_product_impl<Lhs, Rhs>::evalTo(dst, src.lhs(), src.rhs());
  }